

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QDebug operator<<(QDebug debug,QGraphicsItem *item)

{
  QGraphicsItem *this;
  char *pcVar1;
  _func_int **pp_Var2;
  int iVar3;
  QWidget *pQVar4;
  long lVar5;
  storage_type *psVar6;
  QGraphicsItem *in_RDX;
  storage_type *psVar7;
  QTextStream *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QDebugStateSaver saver;
  QDebug local_60;
  undefined1 *local_58;
  QArrayData *local_50;
  undefined8 *local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)item);
  pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
  pQVar8[0x30] = (QTextStream)0x0;
  if (in_RDX == (QGraphicsItem *)0x0) {
    QVar10.m_data = (storage_type *)0x10;
    QVar10.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar8,(QString *)&local_50);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
    if (pQVar8[0x30] == (QTextStream)0x0) goto LAB_005f8277;
  }
  else {
    this = in_RDX + -1;
    if ((((in_RDX->d_ptr).d)->field_0x167 & 1) == 0) {
      QVar9.m_data = (storage_type *)0xd;
      QVar9.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar8,(QString *)&local_50);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
      if (pQVar8[0x30] == (QTextStream)0x1) {
LAB_005f7f31:
        QTextStream::operator<<(pQVar8,' ');
      }
    }
    else {
      (**this->_vptr_QGraphicsItem)(this);
      lVar5 = QMetaObject::className();
      pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
      if (lVar5 == 0) {
        psVar7 = (storage_type *)0x0;
      }
      else {
        psVar6 = (storage_type *)0xffffffffffffffff;
        do {
          psVar7 = psVar6 + 1;
          pcVar1 = psVar6 + lVar5 + 1;
          psVar6 = psVar7;
        } while (*pcVar1 != '\0');
      }
      QVar11.m_data = psVar7;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(pQVar8,(QString *)&local_50);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
      if (pQVar8[0x30] != (QTextStream)0x0) goto LAB_005f7f31;
    }
    QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,'(');
    if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
    }
    QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,in_RDX);
    if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
    }
    iVar3 = (*in_RDX->_vptr_QGraphicsItem[0xb])();
    if (iVar3 == 0xc) {
      pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
      QVar12.m_data = (storage_type *)0x9;
      QVar12.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<(pQVar8,(QString *)&local_50);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
      }
      pQVar4 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)this);
      if (pQVar4 == (QWidget *)0x0) {
        pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
        QVar13.m_data = &DAT_0000000a;
        QVar13.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar13);
        QTextStream::operator<<(pQVar8,(QString *)&local_50);
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
        if (pQVar8[0x30] == (QTextStream)0x1) goto LAB_005f822b;
      }
      else {
        (*(code *)**(undefined8 **)pQVar4)(pQVar4);
        lVar5 = QMetaObject::className();
        pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
        if (lVar5 == 0) {
          psVar7 = (storage_type *)0x0;
        }
        else {
          psVar6 = (storage_type *)0xffffffffffffffff;
          do {
            psVar7 = psVar6 + 1;
            pcVar1 = psVar6 + lVar5 + 1;
            psVar6 = psVar7;
          } while (*pcVar1 != '\0');
        }
        QVar14.m_data = psVar7;
        QVar14.m_size = (qsizetype)&local_50;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<(pQVar8,(QString *)&local_50);
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
        }
        QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,'(');
        if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
        }
        QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,pQVar4);
        if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
        }
        QObject::objectName();
        if (local_50 != (QArrayData *)0x0) {
          LOCK();
          (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50,2,0x10);
          }
        }
        if (local_40 != 0) {
          pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
          QVar15.m_data = (storage_type *)0x7;
          QVar15.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<(pQVar8,(QString *)&local_50);
          if (local_50 != (QArrayData *)0x0) {
            LOCK();
            (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50,2,0x10);
            }
          }
          if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
          }
          QObject::objectName();
          if (local_48 == (undefined8 *)0x0) {
            local_48 = &QString::_empty;
          }
          QDebug::putString((QChar *)item,(ulong)local_48);
          if (((QTextStream *)item->_vptr_QGraphicsItem)[0x30] == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,' ');
          }
          if (local_50 != (QArrayData *)0x0) {
            LOCK();
            (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50,2,0x10);
            }
          }
        }
        QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,')');
        pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
        if (pQVar8[0x30] != (QTextStream)0x0) {
LAB_005f822b:
          QTextStream::operator<<(pQVar8,' ');
        }
      }
    }
    local_60.stream = (Stream *)item->_vptr_QGraphicsItem;
    *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
    formatGraphicsItemHelper(&local_60,in_RDX);
    QDebug::~QDebug(&local_60);
    QTextStream::operator<<((QTextStream *)item->_vptr_QGraphicsItem,')');
    pQVar8 = (QTextStream *)item->_vptr_QGraphicsItem;
    if (pQVar8[0x30] != (QTextStream)0x1) goto LAB_005f8277;
  }
  QTextStream::operator<<(pQVar8,' ');
LAB_005f8277:
  pp_Var2 = item->_vptr_QGraphicsItem;
  item->_vptr_QGraphicsItem = (_func_int **)0x0;
  *(_func_int ***)debug.stream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsItem *item)
{
    QDebugStateSaver saver(debug);
    debug.nospace();

    if (!item) {
        debug << "QGraphicsItem(0)";
        return debug;
    }

    if (const QGraphicsObject *o = item->toGraphicsObject())
        debug << o->metaObject()->className();
    else
        debug << "QGraphicsItem";
    debug << '(' << static_cast<const void *>(item);
    if (const QGraphicsProxyWidget *pw = qgraphicsitem_cast<const QGraphicsProxyWidget *>(item)) {
        debug << ", widget=";
        if (const QWidget *w = pw->widget()) {
            debug << w->metaObject()->className() << '(' << static_cast<const void *>(w);
            if (!w->objectName().isEmpty())
                debug << ", name=" << w->objectName();
            debug << ')';
        } else {
            debug << "QWidget(0)";
        }
    }
    formatGraphicsItemHelper(debug, item);
    debug << ')';
    return debug;
}